

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O3

USTATUS __thiscall
FfsParser::parseFreeformGuidedSectionHeader
          (FfsParser *this,UByteArray *section,UINT32 localOffset,UModelIndex *parent,
          UModelIndex *index,bool insertIntoTree)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte type;
  char cVar2;
  TreeModel *pTVar3;
  bool bVar4;
  UINT32 UVar5;
  USTATUS UVar6;
  uint uVar7;
  UINT8 *ffsSize;
  uint len;
  UByteArray local_130;
  UINT32 local_10c;
  _func_int **local_108;
  UINT8 aUStack_100 [8];
  TreeModel *local_f8;
  EFI_GUID guid;
  size_type __dnew;
  UByteArray header;
  UModelIndex parentVolumeIndex;
  CBString info;
  CBString name;
  UByteArray body;
  
  if (((section->d)._M_string_length & 0xfffffffc) == 0) {
    return 0x14;
  }
  local_10c = localOffset;
  TreeModel::findParentOfType(&parentVolumeIndex,this->model,parent,'A');
  if ((((parentVolumeIndex.r < 0) || (parentVolumeIndex.c < 0)) ||
      (parentVolumeIndex.m == (TreeModel *)0x0)) ||
     (bVar4 = TreeModel::hasEmptyParsingData(this->model,&parentVolumeIndex), bVar4)) {
    ffsSize = (UINT8 *)(section->d)._M_dataplus._M_p;
  }
  else {
    TreeModel::parsingData(&header,this->model,&parentVolumeIndex);
    cVar2 = header.d._M_dataplus._M_p[0x19];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)header.d._M_dataplus._M_p != &header.d.field_2) {
      operator_delete(header.d._M_dataplus._M_p);
    }
    ffsSize = (UINT8 *)(section->d)._M_dataplus._M_p;
    if ((cVar2 == '\x03') && (UVar5 = uint24ToUint32(ffsSize), UVar5 == 0xffffff)) {
      uVar7 = (uint)(section->d)._M_string_length;
      if (uVar7 < 0x18) {
        return 0x14;
      }
      guid._0_8_ = *(undefined8 *)(ffsSize + 8);
      guid.Data4 = *(UINT8 (*) [8])(ffsSize + 0x10);
      len = 0x18;
      goto LAB_001328c7;
    }
  }
  guid._0_8_ = *(undefined8 *)(ffsSize + 4);
  guid.Data4 = *(UINT8 (*) [8])(ffsSize + 0xc);
  uVar7 = (uint)(section->d)._M_string_length;
  len = 0x14;
LAB_001328c7:
  UVar6 = 0x14;
  if (len <= uVar7) {
    type = ffsSize[3];
    UByteArray::left(&header,section,len);
    UByteArray::mid(&body,section,len,-1);
    sectionTypeToUString((CBString *)&local_130,type);
    Bstrlib::CBString::operator+(&name,(CBString *)&local_130," section");
    Bstrlib::CBString::~CBString((CBString *)&local_130);
    uVar7 = (uint)(section->d)._M_string_length;
    usprintf((CBString *)&local_130,
             "Type: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nSubtype GUID: "
             ,(ulong)type,(ulong)uVar7,(ulong)uVar7,(ulong)(uint)header.d._M_string_length,
             (ulong)(uint)header.d._M_string_length,(ulong)(uint)body.d._M_string_length,
             (ulong)(uint)body.d._M_string_length);
    guidToUString((CBString *)&local_108,&guid,false);
    Bstrlib::CBString::operator+(&info,(CBString *)&local_130,(CBString *)&local_108);
    Bstrlib::CBString::~CBString((CBString *)&local_108);
    Bstrlib::CBString::~CBString((CBString *)&local_130);
    if (insertIntoTree) {
      pTVar3 = this->model;
      Bstrlib::CBString::CBString((CBString *)&__dnew);
      paVar1 = &local_130.d.field_2;
      local_130.d._M_string_length = 0;
      local_130.d.field_2._M_allocated_capacity =
           local_130.d.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_130.d._M_dataplus._M_p = (pointer)paVar1;
      TreeModel::addItem((UModelIndex *)&local_108,pTVar3,local_10c,'C',type,&name,
                         (CBString *)&__dnew,&info,&header,&body,&local_130,Movable,parent,'\0');
      index->m = local_f8;
      *(_func_int ***)index = local_108;
      index->i = (uint64_t)aUStack_100;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.d._M_dataplus._M_p != paVar1) {
        operator_delete(local_130.d._M_dataplus._M_p);
      }
      Bstrlib::CBString::~CBString((CBString *)&__dnew);
      local_108 = (_func_int **)guid._0_8_;
      aUStack_100[0] = guid.Data4[0];
      aUStack_100[1] = guid.Data4[1];
      aUStack_100[2] = guid.Data4[2];
      aUStack_100[3] = guid.Data4[3];
      aUStack_100[4] = guid.Data4[4];
      aUStack_100[5] = guid.Data4[5];
      aUStack_100[6] = guid.Data4[6];
      aUStack_100[7] = guid.Data4[7];
      pTVar3 = this->model;
      __dnew = 0x10;
      local_130.d._M_dataplus._M_p = (pointer)paVar1;
      local_130.d._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_130,(ulong)&__dnew);
      local_130.d.field_2._M_allocated_capacity = __dnew;
      *(_func_int ***)local_130.d._M_dataplus._M_p = local_108;
      *(UINT8 (*) [8])((long)local_130.d._M_dataplus._M_p + 8) = aUStack_100;
      local_130.d._M_string_length = __dnew;
      local_130.d._M_dataplus._M_p[__dnew] = '\0';
      TreeModel::setParsingData(pTVar3,index,&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.d._M_dataplus._M_p != paVar1) {
        operator_delete(local_130.d._M_dataplus._M_p);
      }
      pTVar3 = this->model;
      guidToUString((CBString *)&local_130,&guid,true);
      TreeModel::setName(pTVar3,index,(CBString *)&local_130);
      Bstrlib::CBString::~CBString((CBString *)&local_130);
    }
    Bstrlib::CBString::~CBString(&info);
    Bstrlib::CBString::~CBString(&name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)body.d._M_dataplus._M_p != &body.d.field_2) {
      operator_delete(body.d._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)header.d._M_dataplus._M_p != &header.d.field_2) {
      operator_delete(header.d._M_dataplus._M_p);
    }
    UVar6 = 0;
  }
  return UVar6;
}

Assistant:

USTATUS FfsParser::parseFreeformGuidedSectionHeader(const UByteArray & section, const UINT32 localOffset, const UModelIndex & parent, UModelIndex & index, const bool insertIntoTree)
{
    // Check sanity
    if ((UINT32)section.size() < sizeof(EFI_COMMON_SECTION_HEADER))
        return U_INVALID_SECTION;
    
    // Obtain required information from parent volume
    UINT8 ffsVersion = 2;
    UModelIndex parentVolumeIndex = model->findParentOfType(parent, Types::Volume);
    if (parentVolumeIndex.isValid() && model->hasEmptyParsingData(parentVolumeIndex) == false) {
        UByteArray data = model->parsingData(parentVolumeIndex);
        const VOLUME_PARSING_DATA* pdata = (const VOLUME_PARSING_DATA*)data.constData();
        ffsVersion = pdata->ffsVersion;
    }
    
    // Obtain header fields
    UINT32 headerSize;
    EFI_GUID guid;
    UINT8 type;
    const EFI_COMMON_SECTION_HEADER* sectionHeader = (const EFI_COMMON_SECTION_HEADER*)(section.constData());
    const EFI_COMMON_SECTION_HEADER2* section2Header = (const EFI_COMMON_SECTION_HEADER2*)(section.constData());
    
    if (ffsVersion == 3 && uint24ToUint32(sectionHeader->Size) == EFI_SECTION2_IS_USED) { // Check for extended header section
        const EFI_FREEFORM_SUBTYPE_GUID_SECTION* fsgSectionHeader = (const EFI_FREEFORM_SUBTYPE_GUID_SECTION*)(section2Header + 1);
        if ((UINT32)section.size() < sizeof(EFI_COMMON_SECTION_HEADER2) + sizeof(EFI_FREEFORM_SUBTYPE_GUID_SECTION))
            return U_INVALID_SECTION;
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER2) + sizeof(EFI_FREEFORM_SUBTYPE_GUID_SECTION);
        guid = fsgSectionHeader->SubTypeGuid;
        type = section2Header->Type;
    }
    else { // Normal section
        const EFI_FREEFORM_SUBTYPE_GUID_SECTION* fsgSectionHeader = (const EFI_FREEFORM_SUBTYPE_GUID_SECTION*)(sectionHeader + 1);
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER) + sizeof(EFI_FREEFORM_SUBTYPE_GUID_SECTION);
        guid = fsgSectionHeader->SubTypeGuid;
        type = sectionHeader->Type;
    }
    
    // Check sanity again
    if ((UINT32)section.size() < headerSize)
        return U_INVALID_SECTION;
    
    UByteArray header = section.left(headerSize);
    UByteArray body = section.mid(headerSize);
    
    // Get info
    UString name = sectionTypeToUString(type) + (" section");
    UString info = usprintf("Type: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nSubtype GUID: ",
                            type,
                            (UINT32)section.size(), (UINT32)section.size(),
                            (UINT32)header.size(), (UINT32)header.size(),
                            (UINT32)body.size(), (UINT32)body.size())
    + guidToUString(guid, false);
    
    // Add tree item
    if (insertIntoTree) {
        index = model->addItem(localOffset, Types::Section, type, name, UString(), info, header, body, UByteArray(), Movable, parent);
        
        // Set parsing data
        FREEFORM_GUIDED_SECTION_PARSING_DATA pdata = {};
        pdata.guid = guid;
        model->setParsingData(index, UByteArray((const char*)&pdata, sizeof(pdata)));
        
        // Rename section
        model->setName(index, guidToUString(guid));
    }
    
    return U_SUCCESS;
}